

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_alpn_set_negotiated(Curl_cfilter *cf,Curl_easy *data,uchar *proto,size_t proto_len)

{
  bool bVar1;
  _Bool _Var2;
  int bundlestate;
  uchar *local_40;
  uchar *palpn;
  int can_multi;
  size_t proto_len_local;
  uchar *proto_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  bVar1 = false;
  if ((((uint)cf->conn->bits >> 3 & 1) == 0) || (_Var2 = Curl_ssl_cf_is_proxy(cf), !_Var2)) {
    local_40 = &cf->conn->alpn;
  }
  else {
    local_40 = &cf->conn->proxy_alpn;
  }
  if ((proto == (uchar *)0x0) || (proto_len == 0)) {
    *local_40 = '\0';
    if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
      Curl_infof(data,"ALPN: server did not agree on a protocol. Uses default.");
    }
  }
  else {
    if ((proto_len == 8) && (*(long *)proto == 0x312e312f70747468)) {
      *local_40 = '\x02';
    }
    else {
      if ((proto_len != 2) || (*(short *)proto != 0x3268)) {
        *local_40 = '\0';
        Curl_failf(data,"unsupported ALPN protocol: \'%.*s\'",proto_len & 0xffffffff,proto);
        goto LAB_00ae6a80;
      }
      *local_40 = '\x03';
      bVar1 = true;
    }
    if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
      Curl_infof(data,"ALPN: server accepted %.*s",proto_len & 0xffffffff,proto);
    }
  }
LAB_00ae6a80:
  _Var2 = Curl_ssl_cf_is_proxy(cf);
  if (!_Var2) {
    bundlestate = -1;
    if (bVar1) {
      bundlestate = 2;
    }
    Curl_multiuse_state(data,bundlestate);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_alpn_set_negotiated(struct Curl_cfilter *cf,
                                  struct Curl_easy *data,
                                  const unsigned char *proto,
                                  size_t proto_len)
{
  int can_multi = 0;
  unsigned char *palpn =
#ifndef CURL_DISABLE_PROXY
    (cf->conn->bits.tunnel_proxy && Curl_ssl_cf_is_proxy(cf))?
    &cf->conn->proxy_alpn : &cf->conn->alpn
#else
    &cf->conn->alpn
#endif
    ;

  if(proto && proto_len) {
    if(proto_len == ALPN_HTTP_1_1_LENGTH &&
       !memcmp(ALPN_HTTP_1_1, proto, ALPN_HTTP_1_1_LENGTH)) {
      *palpn = CURL_HTTP_VERSION_1_1;
    }
#ifdef USE_HTTP2
    else if(proto_len == ALPN_H2_LENGTH &&
            !memcmp(ALPN_H2, proto, ALPN_H2_LENGTH)) {
      *palpn = CURL_HTTP_VERSION_2;
      can_multi = 1;
    }
#endif
#ifdef USE_HTTP3
    else if(proto_len == ALPN_H3_LENGTH &&
            !memcmp(ALPN_H3, proto, ALPN_H3_LENGTH)) {
      *palpn = CURL_HTTP_VERSION_3;
      can_multi = 1;
    }
#endif
    else {
      *palpn = CURL_HTTP_VERSION_NONE;
      failf(data, "unsupported ALPN protocol: '%.*s'", (int)proto_len, proto);
      /* TODO: do we want to fail this? Previous code just ignored it and
       * some vtls backends even ignore the return code of this function. */
      /* return CURLE_NOT_BUILT_IN; */
      goto out;
    }
    infof(data, VTLS_INFOF_ALPN_ACCEPTED_LEN_1STR, (int)proto_len, proto);
  }
  else {
    *palpn = CURL_HTTP_VERSION_NONE;
    infof(data, VTLS_INFOF_NO_ALPN);
  }

out:
  if(!Curl_ssl_cf_is_proxy(cf))
    Curl_multiuse_state(data, can_multi?
                        BUNDLE_MULTIPLEX : BUNDLE_NO_MULTIUSE);
  return CURLE_OK;
}